

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O0

size_t magic_enum::containers::detail::popcount<unsigned_char>(uchar x)

{
  undefined8 local_18;
  size_t c;
  uchar x_local;
  
  local_18 = 0;
  for (c._7_1_ = x; c._7_1_ != 0; c._7_1_ = (byte)((int)(uint)c._7_1_ >> 1)) {
    local_18 = (long)(int)(c._7_1_ & 1) + local_18;
  }
  return local_18;
}

Assistant:

constexpr std::size_t popcount(T x) noexcept {
  std::size_t c = 0;
  while (x > 0) {
    c += x & 1;
    x >>= 1;
  }
  return c;
}